

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O0

void __thiscall
ClearWrapperCommand::wrapperAction(ClearWrapperCommand *this,ExeElementWrapper *wrapper)

{
  bool bVar1;
  ostream *poVar2;
  Executable *pEVar3;
  long *local_38;
  MappedExe *mExe;
  BYTE filling;
  ExeElementWrapper *wrapper_local;
  ClearWrapperCommand *this_local;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    bVar1 = AbstractByteBuffer::fillContent(&wrapper->super_AbstractByteBuffer,'\0');
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Filled!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pEVar3 = ExeElementWrapper::getExe(wrapper);
      if (pEVar3 == (Executable *)0x0) {
        local_38 = (long *)0x0;
      }
      else {
        local_38 = (long *)__dynamic_cast(pEVar3,&Executable::typeinfo,&MappedExe::typeinfo,0);
      }
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 0x100))();
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to fill...");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (wrapper == NULL) return;
        BYTE filling = 0;
        if (wrapper->fillContent(filling)) {
            std::cout << "Filled!" << std::endl;
        } else {
            std::cout << "Failed to fill..." << std::endl;
            return;
        }
        MappedExe *mExe = dynamic_cast<MappedExe*>(wrapper->getExe());
        if (mExe) {
            mExe->wrap();
        }
    }